

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StorageCount(Fts5Storage *p,char *zSuffix,i64 *pnRow)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  char *zSql;
  Mem *pMem;
  i64 iVar2;
  sqlite3_stmt *pCnt;
  sqlite3_stmt *local_30;
  
  zSql = sqlite3_mprintf("SELECT count(*) FROM %Q.\'%q_%s\'",p->pIndex,
                         *(undefined8 *)&p->bTotalsValid,zSuffix);
  if (zSql == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    local_30 = (sqlite3_stmt *)0x0;
    iVar1 = sqlite3LockAndPrepare
                      ((sqlite3 *)p->pConfig,zSql,-1,0x80,(Vdbe *)0x0,&local_30,(char **)0x0);
    pStmt = local_30;
    if (iVar1 == 0) {
      iVar1 = sqlite3_step(local_30);
      if (iVar1 == 100) {
        pMem = columnMem(pStmt,0);
        iVar2 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        *pnRow = iVar2;
      }
      iVar1 = sqlite3_finalize(pStmt);
    }
    sqlite3_free(zSql);
  }
  return iVar1;
}

Assistant:

static int fts5StorageCount(Fts5Storage *p, const char *zSuffix, i64 *pnRow){
  Fts5Config *pConfig = p->pConfig;
  char *zSql;
  int rc;

  zSql = sqlite3_mprintf("SELECT count(*) FROM %Q.'%q_%s'", 
      pConfig->zDb, pConfig->zName, zSuffix
  );
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3_stmt *pCnt = 0;
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &pCnt, 0);
    if( rc==SQLITE_OK ){
      if( SQLITE_ROW==sqlite3_step(pCnt) ){
        *pnRow = sqlite3_column_int64(pCnt, 0);
      }
      rc = sqlite3_finalize(pCnt);
    }
  }

  sqlite3_free(zSql);
  return rc;
}